

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O2

string * __thiscall
cmFortranParser_s::SModName
          (string *__return_storage_ptr__,cmFortranParser_s *this,string *mod_name,string *sub_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((this->Compiler).SModExt._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,".mod",(allocator<char> *)&local_60);
  }
  else {
    std::__cxx11::string::string((string *)&local_80,(string *)&(this->Compiler).SModExt);
  }
  if ((this->Compiler).SModSep._M_string_length == 0) {
    std::operator+(__return_storage_ptr__,sub_name,&local_80);
  }
  else {
    std::operator+(&local_40,mod_name,&(this->Compiler).SModSep);
    std::operator+(&local_60,&local_40,sub_name);
    std::operator+(__return_storage_ptr__,&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFortranParser_s::SModName(std::string const& mod_name,
                                        std::string const& sub_name) const
{
  std::string const& SModExt =
    this->Compiler.SModExt.empty() ? ".mod" : this->Compiler.SModExt;
  // An empty separator means that the compiler does not use a prefix.
  if (this->Compiler.SModSep.empty()) {
    return sub_name + SModExt;
  }
  return mod_name + this->Compiler.SModSep + sub_name + SModExt;
}